

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int vm_builtin_getopt(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  char *zArgEnd;
  char cVar1;
  jx9_user_func *pjVar2;
  jx9_value *pjVar3;
  jx9_value *pjVar4;
  ushort **ppuVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  char *zArg;
  char *pcVar9;
  jx9_vm *pjVar10;
  int need_val;
  char *pcVar11;
  int c;
  int nByte;
  getopt_long_opt sLong;
  int local_84;
  ulong local_80;
  jx9_value *local_78;
  char *local_70;
  jx9_value **local_68;
  int local_5c;
  char *local_58;
  char *local_50;
  jx9_value *local_48;
  jx9_value *local_40;
  jx9_context *local_38;
  
  if ((nArg < 1) || (((*apArg)->iFlags & 1) == 0)) {
    pjVar2 = pCtx->pFunc;
    pjVar10 = pCtx->pVm;
    pcVar6 = "Missing/Invalid option arguments";
  }
  else {
    pcVar6 = jx9_value_to_string(*apArg,&local_5c);
    pjVar10 = pCtx->pVm;
    pjVar4 = jx9_context_new_array(pCtx);
    local_78 = jx9_context_new_scalar(pCtx);
    if (local_78 != (jx9_value *)0x0 && pjVar4 != (jx9_value *)0x0) {
      uVar7 = (ulong)(pjVar10->sArgv).nByte;
      if (uVar7 != 0) {
        local_70 = (char *)(pjVar10->sArgv).pBlob;
        zArgEnd = local_70 + uVar7;
        local_68 = apArg;
        local_58 = local_70;
        local_50 = zArgEnd;
        local_48 = local_78;
        local_40 = pjVar4;
        local_38 = pCtx;
        if (0 < local_5c) {
          pcVar11 = pcVar6 + local_5c;
          local_80 = uVar7;
          ppuVar5 = __ctype_b_loc();
          local_70 = local_70 + 1;
          uVar7 = local_80;
          do {
            cVar1 = *pcVar6;
            local_84 = (int)cVar1;
            pcVar9 = pcVar6 + 1;
            if (((*ppuVar5)[cVar1] & 8) != 0) {
              need_val = 0;
              uVar8 = uVar7;
              zArg = local_70;
              if ((pcVar9 < pcVar11) && (*pcVar9 == ':')) {
                pcVar9 = pcVar6 + 2;
                need_val = 1;
                if ((pcVar9 < pcVar11) && (pcVar6[2] == ':')) {
                  pcVar9 = pcVar6 + 3;
                }
              }
              do {
                if (((zArg[-1] == '-') && (zArg < zArgEnd)) && (*zArg == cVar1)) goto LAB_0012ca48;
                uVar8 = uVar8 - 1;
                zArg = zArg + 1;
              } while (uVar8 != 0);
              zArg = (char *)0x0;
LAB_0012ca48:
              if (zArg != (char *)0x0) {
                VmExtractOptArgValue(pjVar4,local_78,zArg,zArgEnd,need_val,pCtx,(char *)&local_84);
                uVar7 = local_80;
              }
            }
            pcVar6 = pcVar9;
          } while (pcVar9 < pcVar11);
        }
        if (((nArg != 1) && (pjVar3 = local_68[1], (pjVar3->iFlags & 0x40) != 0)) &&
           (*(int *)((pjVar3->x).iVal + 0x2c) != 0)) {
          jx9HashmapWalk((jx9_hashmap *)(pjVar3->x).pOther,VmProcessLongOpt,&local_58);
        }
      }
      jx9_result_value(pCtx,pjVar4);
      return 0;
    }
    pjVar2 = pCtx->pFunc;
    pjVar10 = pCtx->pVm;
    pcVar6 = "JX9 is running out of memory";
  }
  jx9VmThrowError(pjVar10,&pjVar2->sName,1,pcVar6);
  pjVar4 = pCtx->pRet;
  jx9MemObjRelease(pjVar4);
  (pjVar4->x).rVal = 0.0;
  pjVar4->iFlags = pjVar4->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int vm_builtin_getopt(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zIn, *zEnd, *zArg, *zArgIn, *zArgEnd;
	struct getopt_long_opt sLong;
	jx9_value *pArray, *pWorker;
	SyBlob *pArg;
	int nByte;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "Missing/Invalid option arguments");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract option arguments */
	zIn  = jx9_value_to_string(apArg[0], &nByte);
	zEnd = &zIn[nByte];
	/* Point to the string representation of the $argv[] array */
	pArg = &pCtx->pVm->sArgv;
	/* Create a new empty array and a worker variable */
	pArray = jx9_context_new_array(pCtx);
	pWorker = jx9_context_new_scalar(pCtx);
	if( pArray == 0 || pWorker == 0 ){
		jx9_context_throw_error(pCtx,JX9_CTX_ERR, "JX9 is running out of memory");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	if( SyBlobLength(pArg) < 1 ){
		/* Empty command line, return the empty array*/
		jx9_result_value(pCtx, pArray);
		/* Everything will be released automatically when we return 
		 * from this function.
		 */
		return JX9_OK;
	}
	zArgIn = (const char *)SyBlobData(pArg);
	zArgEnd = &zArgIn[SyBlobLength(pArg)];
	/* Fill the long option structure */
	sLong.pArray = pArray;
	sLong.pWorker = pWorker;
	sLong.zArgIn =  zArgIn;
	sLong.zArgEnd = zArgEnd;
	sLong.pCtx = pCtx;
	/* Start processing */
	while( zIn < zEnd ){
		int c = zIn[0];
		int need_val = 0;
		/* Advance the stream cursor */
		zIn++;
		/* Ignore non-alphanum characters */
		if( !SyisAlphaNum(c) ){
			continue;
		}
		if( zIn < zEnd && zIn[0] == ':' ){
			zIn++;
			need_val = 1;
			if( zIn < zEnd && zIn[0] == ':' ){
				zIn++;
			}
		}
		/* Find option */
		zArg = VmFindShortOpt(c, zArgIn, zArgEnd);
		if( zArg == 0 ){
			/* No such option */
			continue;
		}
		/* Extract option argument value */
		VmExtractOptArgValue(pArray, pWorker, zArg, zArgEnd, need_val, pCtx, (const char *)&c);	
	}
	if( nArg > 1 && jx9_value_is_json_array(apArg[1]) && jx9_array_count(apArg[1]) > 0 ){
		/* Process long options */
		jx9_array_walk(apArg[1], VmProcessLongOpt, &sLong);
	}
	/* Return the option array */
	jx9_result_value(pCtx, pArray);
	/* 
	 * Don't worry about freeing memory, everything will be released
	 * automatically as soon we return from this foreign function.
	 */
	return JX9_OK;
}